

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O3

void __thiscall hwnet::util::TimerMgr::down(TimerMgr *this,size_t idx)

{
  ulong uVar1;
  pointer ppTVar2;
  Timer *pTVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = this->elements_size;
  while( true ) {
    uVar4 = idx * 2;
    uVar5 = idx;
    if ((uVar4 <= uVar1) &&
       (ppTVar2 = (this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start, uVar5 = uVar4,
       ppTVar2[idx - 1]->mExpiredTime <= ppTVar2[idx * 2 + -1]->mExpiredTime)) {
      uVar5 = idx;
    }
    if ((uVar4 < uVar1) &&
       (ppTVar2 = (this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
       ppTVar2[idx * 2]->mExpiredTime < ppTVar2[uVar5 - 1]->mExpiredTime)) {
      uVar5 = idx * 2 + 1;
    }
    if (uVar5 == idx) break;
    ppTVar2 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar3 = ppTVar2[idx - 1];
    ppTVar2[idx - 1] = ppTVar2[uVar5 - 1];
    (this->elements).super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar5 - 1] = pTVar3;
    ppTVar2 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar2[idx - 1]->mIndex = idx;
    ppTVar2[uVar5 - 1]->mIndex = uVar5;
    idx = uVar5;
  }
  return;
}

Assistant:

void down(size_t idx) {
		auto l = left(idx);
		auto r = right(idx);
		auto min = idx;

		auto offsetIdx = getOffset(idx);
		
		if(l <= this->elements_size) {
			auto offsetL = getOffset(l);
			if(this->elements[offsetL]->mExpiredTime < this->elements[offsetIdx]->mExpiredTime) {
				min = l;
			}
		}

		if(r <= this->elements_size) {
			auto offsetR = getOffset(r);
			auto offsetMin = getOffset(min);
			if(this->elements[offsetR]->mExpiredTime < this->elements[offsetMin]->mExpiredTime) {
				min = r;
			}
		}

		if(min != idx) {
			this->swap(idx,min);
			this->down(min);
		}	
	}